

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-records_calendar_dates.c
# Opt level: O0

void CGTFS_RecordCalendarDate(void)

{
  int iVar1;
  greatest_test_res local_10;
  greatest_test_res local_c;
  greatest_test_res res_1;
  greatest_test_res res;
  
  iVar1 = greatest_test_pre("calendar_date_read");
  if (iVar1 == 1) {
    local_c = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (local_c == GREATEST_TEST_RES_PASS) {
      local_c = calendar_date_read();
    }
    greatest_test_post(local_c);
  }
  iVar1 = greatest_test_pre("calendar_date_compare");
  if (iVar1 == 1) {
    local_10 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (local_10 == GREATEST_TEST_RES_PASS) {
      local_10 = calendar_date_compare();
    }
    greatest_test_post(local_10);
  }
  return;
}

Assistant:

SUITE(CGTFS_RecordCalendarDate) {
    RUN_TEST(calendar_date_read);
    RUN_TEST(calendar_date_compare);
}